

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::image::anon_unknown_0::LoadStoreTestInstance::verifyResult
          (TestStatus *__return_storage_ptr__,LoadStoreTestInstance *this)

{
  VkFormat format;
  bool bVar1;
  int iVar2;
  DeviceInterface *vkd;
  undefined4 extraout_var;
  Allocation *this_00;
  VkDeviceSize offset;
  void *pvVar3;
  TestContext *this_01;
  TestLog *log;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_139;
  string local_138;
  ConstPixelBufferAccess local_118;
  ConstPixelBufferAccess local_f0;
  undefined1 local_c4 [12];
  TextureFormat local_b8;
  undefined1 local_b0 [8];
  ConstPixelBufferAccess result;
  Allocation *alloc;
  undefined1 local_50 [8];
  PixelBufferAccess reference;
  VkDevice device;
  DeviceInterface *vk;
  LoadStoreTestInstance *this_local;
  
  vkd = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  reference.super_ConstPixelBufferAccess.m_data =
       Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_50,&this->m_referenceImage);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&alloc,(PixelBufferAccess *)local_50);
  flipHorizontally((PixelBufferAccess *)&alloc);
  iVar2 = (*(this->super_BaseTestInstance).super_TestInstance._vptr_TestInstance[10])();
  this_00 = image::Buffer::getAllocation((Buffer *)CONCAT44(extraout_var,iVar2));
  pvVar3 = reference.super_ConstPixelBufferAccess.m_data;
  result.m_data = (void *)::vk::Allocation::getMemory(this_00);
  offset = ::vk::Allocation::getOffset(this_00);
  ::vk::invalidateMappedMemoryRange
            (vkd,(VkDevice)pvVar3,(VkDeviceMemory)result.m_data,offset,this->m_imageSizeBytes);
  local_b8 = ::vk::mapVkFormat(this->m_imageFormat);
  Texture::size((Texture *)local_c4);
  pvVar3 = ::vk::Allocation::getHostPtr(this_00);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_b0,&local_b8,(IVec3 *)local_c4,pvVar3);
  this_01 = Context::getTestContext((this->super_BaseTestInstance).super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_01);
  format = this->m_imageFormat;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_f0,(ConstPixelBufferAccess *)local_50);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_118,(ConstPixelBufferAccess *)local_b0)
  ;
  bVar1 = comparePixelBuffers(log,&(this->super_BaseTestInstance).m_texture,format,&local_f0,
                              &local_118);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Passed",&local_139);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"Image comparison failed",&local_171);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus LoadStoreTestInstance::verifyResult	(void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	// Apply the same transformation as done in the shader
	const tcu::PixelBufferAccess reference = m_referenceImage.getAccess();
	flipHorizontally(reference);

	const Allocation& alloc = getResultBuffer()->getAllocation();
	invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_imageSizeBytes);
	const tcu::ConstPixelBufferAccess result(mapVkFormat(m_imageFormat), m_texture.size(), alloc.getHostPtr());

	if (comparePixelBuffers(m_context.getTestContext().getLog(), m_texture, m_imageFormat, reference, result))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}